

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.h
# Opt level: O2

bool leveldb::operator==(Slice *x,Slice *y)

{
  int iVar1;
  
  if (x->size_ == y->size_) {
    iVar1 = bcmp(x->data_,y->data_,x->size_);
    return iVar1 == 0;
  }
  return false;
}

Assistant:

size_t size() const { return size_; }